

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<void_*> * __thiscall
kj::ArrayBuilder<void_*>::operator=(ArrayBuilder<void_*> *this,ArrayBuilder<void_*> *other)

{
  void **ppvVar1;
  RemoveConst<void_*> *ppvVar2;
  void **ppvVar3;
  ArrayDisposer *pAVar4;
  
  ppvVar1 = this->ptr;
  if (ppvVar1 != (void **)0x0) {
    ppvVar2 = this->pos;
    ppvVar3 = this->endPtr;
    this->ptr = (void **)0x0;
    this->pos = (RemoveConst<void_*> *)0x0;
    this->endPtr = (void **)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,ppvVar1,8,(long)ppvVar2 - (long)ppvVar1 >> 3,
               (long)ppvVar3 - (long)ppvVar1 >> 3,0);
  }
  ppvVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = ppvVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (void **)0x0;
  other->pos = (RemoveConst<void_*> *)0x0;
  other->endPtr = (void **)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }